

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePartFunction<duckdb::date_t>(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  long *plVar4;
  idx_t count;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  reference vector;
  reference vector_00;
  long lVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  data_ptr_t pdVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  data_ptr_t pdVar16;
  idx_t i;
  ulong uVar17;
  ValidityMask *pVVar18;
  idx_t iVar19;
  idx_t i_1;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar4 = (long *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      lVar8 = BinaryLambdaWrapperWithNulls::
              Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                        (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                         *(undefined4 *)vector_00->data,&result->validity,0);
      *plVar4 = lVar8;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar12 = vector->data;
      pdVar5 = vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar18 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&pVVar18->super_TemplatedValidityMask<unsigned_long>,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar12 = pdVar12 + 8;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            lVar8 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                              (*(undefined8 *)(pdVar12 + -8),*(undefined8 *)pdVar12,
                               *(undefined4 *)pdVar5,pVVar18,iVar19);
            *(long *)(pdVar6 + iVar19 * 8) = lVar8;
            pdVar12 = pdVar12 + 0x10;
          }
          return;
        }
        uVar14 = 0;
        uVar17 = 0;
        do {
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (pVVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar11 = uVar17 + 0x40;
            if (count <= uVar17 + 0x40) {
              uVar11 = count;
            }
LAB_01d84c2d:
            pdVar16 = pdVar12 + uVar17 * 0x10 + 8;
            for (; uVar15 = uVar17, uVar17 < uVar11; uVar17 = uVar17 + 1) {
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                (*(undefined8 *)(pdVar16 + -8),*(undefined8 *)pdVar16,
                                 *(undefined4 *)pdVar5,pVVar18,uVar17);
              *(long *)(pdVar6 + uVar17 * 8) = lVar8;
              pdVar16 = pdVar16 + 0x10;
            }
          }
          else {
            uVar7 = puVar3[uVar14];
            uVar11 = uVar17 + 0x40;
            if (count <= uVar17 + 0x40) {
              uVar11 = count;
            }
            if (uVar7 == 0xffffffffffffffff) goto LAB_01d84c2d;
            uVar15 = uVar11;
            if (uVar7 != 0) {
              pdVar16 = pdVar12 + uVar17 * 0x10 + 8;
              for (uVar13 = 0; uVar15 = uVar17 + uVar13, uVar17 + uVar13 < uVar11;
                  uVar13 = uVar13 + 1) {
                if ((uVar7 >> (uVar13 & 0x3f) & 1) != 0) {
                  lVar8 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                    (*(undefined8 *)(pdVar16 + -8),*(undefined8 *)pdVar16,
                                     *(undefined4 *)pdVar5,pVVar18);
                  *(long *)(pdVar6 + uVar13 * 8 + uVar17 * 8) = lVar8;
                }
                pdVar16 = pdVar16 + 0x10;
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar17 = uVar15;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar12 = vector->data;
          pdVar5 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar18 = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          TemplatedValidityMask<unsigned_long>::Copy
                    (&pVVar18->super_TemplatedValidityMask<unsigned_long>,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          FlatVector::VerifyFlatVector(vector_00);
          if (puVar3 == (unsigned_long *)0x0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (&pVVar18->super_TemplatedValidityMask<unsigned_long>,
                       &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
          }
          else {
            ValidityMask::Combine(pVVar18,&vector_00->validity,count);
          }
          if ((pVVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            pdVar12 = pdVar12 + 8;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                (*(undefined8 *)(pdVar12 + -8),*(undefined8 *)pdVar12,
                                 *(undefined4 *)(pdVar5 + iVar19 * 4),pVVar18,iVar19);
              *(long *)(pdVar6 + iVar19 * 8) = lVar8;
              pdVar12 = pdVar12 + 0x10;
            }
          }
          else {
            uVar17 = 0;
            for (uVar14 = 0; uVar14 != count + 0x3f >> 6; uVar14 = uVar14 + 1) {
              puVar3 = (pVVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar11 = uVar17 + 0x40;
                if (count <= uVar17 + 0x40) {
                  uVar11 = count;
                }
LAB_01d8519e:
                pdVar16 = pdVar12 + uVar17 * 0x10 + 8;
                for (; uVar15 = uVar17, uVar17 < uVar11; uVar17 = uVar17 + 1) {
                  lVar8 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                    (*(undefined8 *)(pdVar16 + -8),*(undefined8 *)pdVar16,
                                     *(undefined4 *)(pdVar5 + uVar17 * 4),pVVar18,uVar17);
                  *(long *)(pdVar6 + uVar17 * 8) = lVar8;
                  pdVar16 = pdVar16 + 0x10;
                }
              }
              else {
                uVar7 = puVar3[uVar14];
                uVar11 = uVar17 + 0x40;
                if (count <= uVar17 + 0x40) {
                  uVar11 = count;
                }
                if (uVar7 == 0xffffffffffffffff) goto LAB_01d8519e;
                uVar15 = uVar11;
                if (uVar7 != 0) {
                  pdVar16 = pdVar12 + uVar17 * 0x10 + 8;
                  for (uVar13 = 0; uVar15 = uVar17 + uVar13, uVar15 < uVar11; uVar13 = uVar13 + 1) {
                    if ((uVar7 >> (uVar13 & 0x3f) & 1) != 0) {
                      lVar8 = BinaryLambdaWrapperWithNulls::
                              Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                        (*(undefined8 *)(pdVar16 + -8),*(undefined8 *)pdVar16,
                                         *(undefined4 *)(pdVar5 + uVar13 * 4 + uVar17 * 4),pVVar18);
                      *(long *)(pdVar6 + uVar13 * 8 + uVar17 * 8) = lVar8;
                    }
                    pdVar16 = pdVar16 + 0x10;
                  }
                }
              }
              uVar17 = uVar15;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&ldata);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar18 = &result->validity;
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar9 = iVar19;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(ldata.sel)->sel_vector[iVar19];
              }
              iVar10 = iVar19;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar19];
              }
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                (*(undefined8 *)(ldata.data + iVar9 * 0x10),
                                 *(undefined8 *)(ldata.data + iVar9 * 0x10 + 8),
                                 *(undefined4 *)(local_c0.data + iVar10 * 4),pVVar18,iVar19);
              *(long *)(pdVar12 + iVar19 * 8) = lVar8;
            }
          }
          else {
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar9 = iVar19;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(ldata.sel)->sel_vector[iVar19];
              }
              iVar10 = iVar19;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar19];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)))) {
                lVar8 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                  (*(undefined8 *)(ldata.data + iVar9 * 0x10),
                                   *(undefined8 *)(ldata.data + iVar9 * 0x10 + 8),
                                   *(undefined4 *)(local_c0.data + iVar10 * 4),pVVar18,iVar19);
                *(long *)(pdVar12 + iVar19 * 8) = lVar8;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&pVVar18->super_TemplatedValidityMask<unsigned_long>,iVar19);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      pdVar12 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar5 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar18 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&pVVar18->super_TemplatedValidityMask<unsigned_long>,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            lVar8 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                              (*(undefined8 *)pdVar12,*(undefined8 *)(pdVar12 + 8),
                               *(undefined4 *)(pdVar5 + iVar19 * 4),pVVar18,iVar19);
            *(long *)(pdVar6 + iVar19 * 8) = lVar8;
          }
          return;
        }
        uVar14 = 0;
        uVar17 = 0;
        do {
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (pVVar18->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar11 = uVar17 + 0x40;
            if (count <= uVar17 + 0x40) {
              uVar11 = count;
            }
LAB_01d84ef4:
            for (; uVar15 = uVar17, uVar17 < uVar11; uVar17 = uVar17 + 1) {
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                (*(undefined8 *)pdVar12,*(undefined8 *)(pdVar12 + 8),
                                 *(undefined4 *)(pdVar5 + uVar17 * 4),pVVar18,uVar17);
              *(long *)(pdVar6 + uVar17 * 8) = lVar8;
            }
          }
          else {
            uVar7 = puVar3[uVar14];
            uVar11 = uVar17 + 0x40;
            if (count <= uVar17 + 0x40) {
              uVar11 = count;
            }
            if (uVar7 == 0xffffffffffffffff) goto LAB_01d84ef4;
            uVar15 = uVar11;
            if (uVar7 != 0) {
              for (uVar13 = 0; uVar15 = uVar17 + uVar13, uVar15 < uVar11; uVar13 = uVar13 + 1) {
                if ((uVar7 >> (uVar13 & 0x3f) & 1) != 0) {
                  lVar8 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::date_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::date_t,long>
                                    (*(undefined8 *)pdVar12,*(undefined8 *)(pdVar12 + 8),
                                     *(undefined4 *)(pdVar5 + uVar13 * 4 + uVar17 * 4),pVVar18);
                  *(long *)(pdVar6 + uVar13 * 8 + uVar17 * 8) = lVar8;
                }
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar17 = uVar15;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}